

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_UTF8Reader.cpp
# Opt level: O2

char * __thiscall soul::UTF8Reader::findInvalidData(UTF8Reader *this)

{
  byte bVar1;
  byte *pbVar2;
  UnicodeChar UVar3;
  uint uVar4;
  int iVar5;
  long lVar6;
  byte *pbVar7;
  UTF8Reader local_38;
  
  pbVar2 = (byte *)this->data;
  do {
    do {
      pbVar7 = pbVar2;
      uVar4 = 0x40;
      bVar1 = *pbVar7;
      if (bVar1 == 0) {
        return (char *)0x0;
      }
      pbVar2 = pbVar7 + 1;
    } while (-1 < (char)bVar1);
    lVar6 = 0;
    while (iVar5 = (int)lVar6, (uVar4 & bVar1) != 0) {
      if (iVar5 == -4) {
        return (char *)pbVar7;
      }
      uVar4 = uVar4 >> 1;
      if ((uVar4 == 8) &&
         (local_38.data = (char *)(pbVar7 + 1), UVar3 = operator*(&local_38), 0x10ffff < UVar3)) {
        return (char *)pbVar7;
      }
      lVar6 = lVar6 + -1;
    }
    if (iVar5 == 0) {
      return (char *)pbVar7;
    }
    pbVar2 = pbVar7 + (1 - lVar6);
  } while (-1 < iVar5);
  return (char *)pbVar7;
}

Assistant:

const char* UTF8Reader::findInvalidData() const
{
    for (auto t = data; *t != 0;)
    {
        auto byte = (signed char) *t++;

        if (byte < 0)
        {
            auto errorPos = t - 1;
            int bit = 0x40;
            int numExtraValues = 0;

            while ((byte & bit) != 0)
            {
                if (bit < 8)
                    return errorPos;

                ++numExtraValues;
                bit >>= 1;

                if (bit == 8 && *UTF8Reader (t) > 0x10ffff)
                    return errorPos;
            }

            if (numExtraValues == 0)
                return errorPos;

            while (--numExtraValues >= 0)
                if ((*t++ & 0xc0) != 0x80)
                    return errorPos;
        }
    }

    return nullptr;
}